

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::SerializeMapKeyWithCachedSizes
                    (FieldDescriptor *field,MapKey *value,uint8_t *target,
                    EpsCopyOutputStream *stream)

{
  bool value_00;
  uint32_t uVar1;
  int32_t iVar2;
  uint8_t *puVar3;
  size_t __n;
  uint64_t uVar4;
  int64_t iVar5;
  string_view s;
  LogMessageFatal local_30 [16];
  
  puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  switch(field->type_) {
  case '\x01':
  case '\x02':
  case '\n':
  case '\v':
  case '\f':
  case '\x0e':
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/wire_format.cc"
               ,0x442);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_30,(char (*) [12])"Unsupported");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
  case '\x03':
    iVar5 = MapKey::GetInt64Value(value);
    puVar3 = WireFormatLite::WriteInt64ToArray(1,iVar5,puVar3);
    return puVar3;
  case '\x04':
    uVar4 = MapKey::GetUInt64Value(value);
    puVar3 = WireFormatLite::WriteUInt64ToArray(1,uVar4,puVar3);
    return puVar3;
  case '\x05':
    iVar2 = MapKey::GetInt32Value(value);
    puVar3 = WireFormatLite::WriteInt32ToArray(1,iVar2,puVar3);
    return puVar3;
  case '\x06':
    uVar4 = MapKey::GetUInt64Value(value);
    puVar3 = WireFormatLite::WriteFixed64ToArray(1,uVar4,puVar3);
    return puVar3;
  case '\a':
    uVar1 = MapKey::GetUInt32Value(value);
    puVar3 = WireFormatLite::WriteFixed32ToArray(1,uVar1,puVar3);
    return puVar3;
  case '\b':
    value_00 = MapKey::GetBoolValue(value);
    puVar3 = WireFormatLite::WriteBoolToArray(1,value_00,puVar3);
    return puVar3;
  case '\t':
    s = MapKey::GetStringValue(value);
    __n = s._M_len;
    if ((0x7f < (long)__n) || ((long)(stream->end_ + (0xe - (long)puVar3)) < (long)__n)) {
      puVar3 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,puVar3);
      return puVar3;
    }
    *puVar3 = '\n';
    puVar3[1] = (uint8_t)s._M_len;
    memcpy(puVar3 + 2,s._M_str,__n);
    puVar3 = puVar3 + __n + 2;
    break;
  case '\r':
    uVar1 = MapKey::GetUInt32Value(value);
    puVar3 = WireFormatLite::WriteUInt32ToArray(1,uVar1,puVar3);
    return puVar3;
  case '\x0f':
    iVar2 = MapKey::GetInt32Value(value);
    puVar3 = WireFormatLite::WriteSFixed32ToArray(1,iVar2,puVar3);
    return puVar3;
  case '\x10':
    iVar5 = MapKey::GetInt64Value(value);
    puVar3 = WireFormatLite::WriteSFixed64ToArray(1,iVar5,puVar3);
    return puVar3;
  case '\x11':
    iVar2 = MapKey::GetInt32Value(value);
    puVar3 = WireFormatLite::WriteSInt32ToArray(1,iVar2,puVar3);
    return puVar3;
  case '\x12':
    iVar5 = MapKey::GetInt64Value(value);
    puVar3 = WireFormatLite::WriteSInt64ToArray(1,iVar5,puVar3);
    return puVar3;
  }
  return puVar3;
}

Assistant:

uint8_t* SerializeMapKeyWithCachedSizes(const FieldDescriptor* field,
                                        const MapKey& value, uint8_t* target,
                                        io::EpsCopyOutputStream* stream) {
  target = stream->EnsureSpace(target);
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      ABSL_LOG(FATAL) << "Unsupported";
      break;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType)   \
  case FieldDescriptor::TYPE_##FieldType:                    \
    target = WireFormatLite::Write##CamelFieldType##ToArray( \
        1, value.Get##CamelCppType##Value(), target);        \
    break;
      CASE_TYPE(INT64, Int64, Int64)
      CASE_TYPE(UINT64, UInt64, UInt64)
      CASE_TYPE(INT32, Int32, Int32)
      CASE_TYPE(FIXED64, Fixed64, UInt64)
      CASE_TYPE(FIXED32, Fixed32, UInt32)
      CASE_TYPE(BOOL, Bool, Bool)
      CASE_TYPE(UINT32, UInt32, UInt32)
      CASE_TYPE(SFIXED32, SFixed32, Int32)
      CASE_TYPE(SFIXED64, SFixed64, Int64)
      CASE_TYPE(SINT32, SInt32, Int32)
      CASE_TYPE(SINT64, SInt64, Int64)
#undef CASE_TYPE
    case FieldDescriptor::TYPE_STRING:
      target = stream->WriteString(1, value.GetStringValue(), target);
      break;
  }
  return target;
}